

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O1

double __thiscall chrono::ChConstraintThreeBBShaft::Compute_Cq_q(ChConstraintThreeBBShaft *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChVariables *pCVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *local_38;
  long local_30;
  undefined1 *local_20;
  undefined1 local_18 [8];
  
  pCVar3 = (this->super_ChConstraintThree).variables_a;
  dVar4 = 0.0;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_38,pCVar3);
    if (local_30 != 6) goto LAB_007f690c;
    local_20 = local_18;
    dVar4 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[0] * *local_38 +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[2] * local_38[2] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[4] * local_38[4] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[1] * local_38[1] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[3] * local_38[3] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[5] * local_38[5] + 0.0;
  }
  pCVar3 = (this->super_ChConstraintThree).variables_b;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_38,pCVar3);
    if (local_30 != 6) {
LAB_007f690c:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 1, 6, 1>, Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 1, 6, 1>, Rhs = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Option = 0]"
                   );
    }
    local_20 = local_18;
    dVar4 = dVar4 + (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[0] * *local_38 +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[2] * local_38[2] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[4] * local_38[4] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[1] * local_38[1] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[3] * local_38[3] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[5] * local_38[5];
  }
  pCVar3 = (this->super_ChConstraintThree).variables_c;
  if (pCVar3->disabled == false) {
    dVar1 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
            m_data.array[0];
    ChVariables::Get_qb((ChVectorRef *)&local_38,pCVar3);
    if (local_30 < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                   );
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar4;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *local_38;
    auVar2 = vfmadd231sd_fma(auVar5,auVar6,auVar2);
    dVar4 = auVar2._0_8_;
  }
  return dVar4;
}

Assistant:

double ChConstraintThreeBBShaft::Compute_Cq_q() {
    double ret = 0;

    if (variables_a->IsActive()) {
        ret += Cq_a * variables_a->Get_qb();
    }

    if (variables_b->IsActive()) {
        ret += Cq_b * variables_b->Get_qb();
    }

    if (variables_c->IsActive()) {
        ret += Cq_c(0) * variables_c->Get_qb()(0);
    }

    return ret;
}